

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O3

void __thiscall p2t::Triangle::SetDelunayEdgeCCW(Triangle *this,Point *p,bool e)

{
  long lVar1;
  
  lVar1 = 5;
  if (this->points_[0] != p) {
    lVar1 = (ulong)(this->points_[1] != p) + 3;
  }
  this->constrained_edge[lVar1] = e;
  return;
}

Assistant:

void Triangle::SetDelunayEdgeCCW(const Point& p, bool e)
{
  if (&p == points_[0]) {
    delaunay_edge[2] = e;
  } else if (&p == points_[1]) {
    delaunay_edge[0] = e;
  } else {
    delaunay_edge[1] = e;
  }
}